

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<bool>::growTo(vec<bool> *this,uint size)

{
  bool *pbVar1;
  ulong uVar2;
  
  if (this->sz < size) {
    reserve(this,size);
    pbVar1 = this->data;
    for (uVar2 = (ulong)this->sz; uVar2 < size; uVar2 = uVar2 + 1) {
      pbVar1[uVar2] = false;
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T();
		}
		sz = size;
	}